

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_sample.cpp
# Opt level: O3

OperatorResultType __thiscall
duckdb::PhysicalStreamingSample::Execute
          (PhysicalStreamingSample *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk
          ,GlobalOperatorState *gstate,OperatorState *state)

{
  pointer pSVar1;
  InternalException *this_00;
  double dVar2;
  string local_48;
  
  pSVar1 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
           operator->(&this->sample_options);
  if (pSVar1->method == SYSTEM_SAMPLE) {
    dVar2 = RandomEngine::NextRandom((RandomEngine *)(state + 1));
    if (dVar2 <= this->percentage) {
      DataChunk::Reference(chunk,input);
    }
  }
  else {
    if (pSVar1->method != BERNOULLI_SAMPLE) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Unsupported sample method for streaming sample","");
      InternalException::InternalException(this_00,&local_48);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    BernoulliSample(this,input,chunk,state);
  }
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType PhysicalStreamingSample::Execute(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                    GlobalOperatorState &gstate, OperatorState &state) const {
	switch (sample_options->method) {
	case SampleMethod::BERNOULLI_SAMPLE:
		BernoulliSample(input, chunk, state);
		break;
	case SampleMethod::SYSTEM_SAMPLE:
		SystemSample(input, chunk, state);
		break;
	default:
		throw InternalException("Unsupported sample method for streaming sample");
	}
	return OperatorResultType::NEED_MORE_INPUT;
}